

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O3

void __thiscall
flatbuffers::anon_unknown_7::GenerateRegion
          (anon_unknown_7 *this,ostream *os,BinaryRegion *region,BinarySection *section,
          uint8_t *binary,OutputConfig *output_config)

{
  ostream *poVar1;
  undefined8 extraout_RAX;
  uint8_t i;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  DocContinuation doc_continuation;
  string local_90;
  ulong local_70;
  BinaryRegion *local_68;
  BinaryRegion *local_60;
  uint8_t local_58 [8];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_48 = 0;
  local_40 = 0;
  if (*(long *)(os + 8) != 0) {
    uVar5 = 2;
    uVar3 = 0;
    local_70 = 0;
    local_68 = region;
    local_60 = (BinaryRegion *)os;
    do {
      if (uVar3 % (section->name).field_2._M_allocated_capacity == 0) {
        std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
        std::ostream::put((char)this);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  +0x",5);
        ToHex<unsigned_long>
                  (&local_90,((BinaryRegion *)os)->offset + uVar3,
                   *(size_t *)((long)&(section->name).field_2 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,
                   (char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_)
                   ,local_90._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
            &local_90.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                          local_90.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
        local_90._M_dataplus._M_p._0_1_ = (undefined1)section->type;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_90,1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
      ToHex_abi_cxx11_(&local_90,
                       (flatbuffers *)
                       (ulong)*(byte *)((long)&local_68->offset +
                                       uVar3 + ((BinaryRegion *)os)->offset),i);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,
                 (char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                 local_90._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
          &local_90.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                        local_90.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 + 1;
      uVar2 = uVar3 % (section->name).field_2._M_allocated_capacity;
      if (uVar3 == ((BinaryRegion *)os)->length || uVar2 == 0) {
        uVar4 = uVar5;
        if (uVar2 != 0 && uVar3 == ((BinaryRegion *)os)->length) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"   ",3);
            uVar2 = uVar4 % (section->name).field_2._M_allocated_capacity;
            uVar4 = uVar4 + 1;
          } while (uVar2 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
        os = (ostream *)local_60;
        local_90._M_dataplus._M_p._0_1_ = (undefined1)section->type;
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this,(char *)&local_90,1);
        uVar2 = local_70 & 1;
        local_70 = CONCAT71((int7)((ulong)poVar1 >> 8),1);
        if (uVar2 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
          GenerateDocumentation
                    ((ostream *)this,(BinaryRegion *)os,(BinarySection *)local_68,local_58,
                     (DocContinuation *)section,output_config);
          local_70 = CONCAT71((int7)((ulong)extraout_RAX >> 8),local_48 == 0);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 < ((BinaryRegion *)os)->length);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
  }
  return;
}

Assistant:

static void GenerateRegion(std::ostream &os, const BinaryRegion &region,
                           const BinarySection &section, const uint8_t *binary,
                           const OutputConfig &output_config) {
  bool doc_generated = false;
  DocContinuation doc_continuation;
  for (uint64_t i = 0; i < region.length; ++i) {
    if ((i % output_config.max_bytes_per_line) == 0) {
      // Start a new line of output
      os << std::endl;
      os << "  +0x" << ToHex(region.offset + i, output_config.offset_max_char);
      os << " " << output_config.delimiter;
    }

    // Add each byte
    os << " " << ToHex(binary[region.offset + i]);

    // Check for end of line or end of region conditions.
    if (((i + 1) % output_config.max_bytes_per_line == 0) ||
        i + 1 == region.length) {
      if (i + 1 == region.length) {
        // We are out of bytes but haven't the kMaxBytesPerLine, so we need to
        // zero those out to align everything globally.
        for (uint64_t j = i + 1; (j % output_config.max_bytes_per_line) != 0;
             ++j) {
          os << "   ";
        }
      }
      os << " " << output_config.delimiter;
      // This is the end of the first line or its the last byte of the region,
      // generate the end-of-line documentation.
      if (!doc_generated) {
        os << " ";
        GenerateDocumentation(os, region, section, binary, doc_continuation,
                              output_config);

        // If we have a value in the doc continuation, that means the doc is
        // being printed on multiple lines.
        doc_generated = doc_continuation.value.empty();
      }
    }
  }
}